

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexerHelper.cxx
# Opt level: O0

bool __thiscall cmGccDepfileLexerHelper::readFile(cmGccDepfileLexerHelper *this,char *filePath)

{
  yyscan_t local_30;
  yyscan_t scanner;
  FILE *file;
  char *filePath_local;
  cmGccDepfileLexerHelper *this_local;
  
  file = (FILE *)filePath;
  filePath_local = (char *)this;
  scanner = fopen(filePath,"r");
  if ((FILE *)scanner == (FILE *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    newEntry(this);
    cmGccDepfile_yylex_init(&local_30);
    cmGccDepfile_yyset_extra(this,local_30);
    cmGccDepfile_yyrestart((FILE *)scanner,local_30);
    cmGccDepfile_yylex(local_30);
    cmGccDepfile_yylex_destroy(local_30);
    sanitizeContent(this);
    fclose((FILE *)scanner);
    this_local._7_1_ = this->HelperState != Failed;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGccDepfileLexerHelper::readFile(const char* filePath)
{
#ifdef _WIN32
  wchar_t* wpath = cmsysEncoding_DupToWide(filePath);
  FILE* file = _wfopen(wpath, L"rb");
  free(wpath);
#else
  FILE* file = fopen(filePath, "r");
#endif
  if (!file) {
    return false;
  }
  this->newEntry();
  yyscan_t scanner;
  cmGccDepfile_yylex_init(&scanner);
  cmGccDepfile_yyset_extra(this, scanner);
  cmGccDepfile_yyrestart(file, scanner);
  cmGccDepfile_yylex(scanner);
  cmGccDepfile_yylex_destroy(scanner);
  this->sanitizeContent();
  fclose(file);
  return this->HelperState != State::Failed;
}